

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

Sat_MmStep_t * Sat_MmStepStart(int nSteps)

{
  int iVar1;
  Sat_MmStep_t *pSVar2;
  Sat_MmFixed_t **ppSVar3;
  Sat_MmFixed_t *pSVar4;
  Sat_MmFixed_t **ppSVar5;
  char **ppcVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  pSVar2 = (Sat_MmStep_t *)malloc(0x30);
  pSVar2->nMems = nSteps;
  ppSVar3 = (Sat_MmFixed_t **)malloc((long)nSteps * 8);
  pSVar2->pMems = ppSVar3;
  uVar9 = 0;
  uVar8 = 0;
  if (0 < nSteps) {
    uVar8 = (ulong)(uint)nSteps;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    pSVar4 = Sat_MmFixedStart(8 << ((byte)uVar9 & 0x1f));
    ppSVar3[uVar9] = pSVar4;
  }
  iVar1 = 4 << ((byte)nSteps & 0x1f);
  pSVar2->nMapSize = iVar1;
  ppSVar5 = (Sat_MmFixed_t **)malloc((long)(iVar1 + 1) << 3);
  *ppSVar5 = (Sat_MmFixed_t *)0x0;
  pSVar2->pMap = ppSVar5;
  pSVar4 = *ppSVar3;
  for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
    ppSVar5[lVar7 + 1] = pSVar4;
  }
  for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    for (lVar7 = (long)((4 << ((byte)uVar9 & 0x1f)) + 1); lVar7 <= 8 << ((byte)uVar9 & 0x1f);
        lVar7 = lVar7 + 1) {
      ppSVar5[lVar7] = ppSVar3[uVar9];
    }
  }
  pSVar2->nChunksAlloc = 0x40;
  pSVar2->nChunks = 0;
  ppcVar6 = (char **)malloc(0x200);
  pSVar2->pChunks = ppcVar6;
  return pSVar2;
}

Assistant:

Sat_MmStep_t * Sat_MmStepStart( int nSteps )
{
    Sat_MmStep_t * p;
    int i, k;
    p = ABC_ALLOC( Sat_MmStep_t, 1 );
    p->nMems = nSteps;
    // start the fixed memory managers
    p->pMems = ABC_ALLOC( Sat_MmFixed_t *, p->nMems );
    for ( i = 0; i < p->nMems; i++ )
        p->pMems[i] = Sat_MmFixedStart( (8<<i) );
    // set up the mapping of the required memory size into the corresponding manager
    p->nMapSize = (4<<p->nMems);
    p->pMap = ABC_ALLOC( Sat_MmFixed_t *, p->nMapSize+1 );
    p->pMap[0] = NULL;
    for ( k = 1; k <= 4; k++ )
        p->pMap[k] = p->pMems[0];
    for ( i = 0; i < p->nMems; i++ )
        for ( k = (4<<i)+1; k <= (8<<i); k++ )
            p->pMap[k] = p->pMems[i];
//for ( i = 1; i < 100; i ++ )
//printf( "%10d: size = %10d\n", i, p->pMap[i]->nEntrySize );
    p->nChunksAlloc  = 64;
    p->nChunks       = 0;
    p->pChunks       = ABC_ALLOC( char *, p->nChunksAlloc );
    return p;
}